

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void windowAggFinal(Parse *pParse,Window *pMWin,int bFinal)

{
  ExprList *pEVar1;
  ExprList *pList;
  Vdbe *p;
  int iVar2;
  
  p = sqlite3GetVdbe(pParse);
  for (; pMWin != (Window *)0x0; pMWin = pMWin->pNextWin) {
    if (((pMWin->pFunc->funcFlags & 0x1000) == 0) || (pMWin->eStart == 'W')) {
      if (pMWin->regApp == 0) {
        pEVar1 = (pMWin->pOwner->x).pList;
        if (bFinal == 0) {
          if (pEVar1 == (ExprList *)0x0) {
            iVar2 = 0;
          }
          else {
            iVar2 = pEVar1->nExpr;
          }
          sqlite3VdbeAddOp3(p,0x9d,pMWin->regAccum,iVar2,pMWin->regResult);
          sqlite3VdbeAppendP4(p,pMWin->pFunc,-8);
        }
        else {
          if (pEVar1 == (ExprList *)0x0) {
            iVar2 = 0;
          }
          else {
            iVar2 = pEVar1->nExpr;
          }
          sqlite3VdbeAddOp2(p,0x9e,pMWin->regAccum,iVar2);
          sqlite3VdbeAppendP4(p,pMWin->pFunc,-8);
          sqlite3VdbeAddOp2(p,0x4e,pMWin->regAccum,pMWin->regResult);
          sqlite3VdbeAddOp2(p,0x49,0,pMWin->regAccum);
        }
      }
    }
    else {
      sqlite3VdbeAddOp2(p,0x49,0,pMWin->regResult);
      sqlite3VdbeAddOp1(p,0x20,pMWin->csrApp);
      sqlite3VdbeAddOp3(p,0x5a,pMWin->csrApp,0,pMWin->regResult);
      sqlite3VdbeJumpHere(p,p->nOp + -2);
      if (bFinal != 0) {
        sqlite3VdbeAddOp1(p,0x8b,pMWin->csrApp);
      }
    }
  }
  return;
}

Assistant:

static void windowAggFinal(Parse *pParse, Window *pMWin, int bFinal){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    if( (pWin->pFunc->funcFlags & SQLITE_FUNC_MINMAX) 
     && pWin->eStart!=TK_UNBOUNDED 
    ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      sqlite3VdbeAddOp1(v, OP_Last, pWin->csrApp);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, pWin->csrApp, 0, pWin->regResult);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      if( bFinal ){
        sqlite3VdbeAddOp1(v, OP_ResetSorter, pWin->csrApp);
      }
    }else if( pWin->regApp ){
    }else{
      if( bFinal ){
        sqlite3VdbeAddOp2(v, OP_AggFinal, pWin->regAccum, windowArgCount(pWin));
        sqlite3VdbeAppendP4(v, pWin->pFunc, P4_FUNCDEF);
        sqlite3VdbeAddOp2(v, OP_Copy, pWin->regAccum, pWin->regResult);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
      }else{
        sqlite3VdbeAddOp3(v, OP_AggValue, pWin->regAccum, windowArgCount(pWin),
                             pWin->regResult);
        sqlite3VdbeAppendP4(v, pWin->pFunc, P4_FUNCDEF);
      }
    }
  }
}